

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-cc.cpp
# Opt level: O1

void mouseMotionCallback(GLFWwindow *window,double x,double y)

{
  double dVar1;
  double dVar2;
  float_t fVar3;
  float_t fVar4;
  float_t fVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  ImGuiIO *pIVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  mat3 local_60;
  mat3 local_3c;
  
  dVar1 = x - mouseMotionCallback::x0;
  dVar2 = y - mouseMotionCallback::y0;
  pIVar9 = ImGui::GetIO();
  dVar6 = mouseMotionCallback::x0;
  dVar7 = mouseMotionCallback::y0;
  if (pIVar9->WantCaptureMouse == false) {
    iVar8 = glfwGetMouseButton(window,0);
    fVar4 = g_camera.axis.m[1].y;
    if (iVar8 == 1) {
      fVar3 = g_camera.axis.m[0].y;
      fVar5 = g_camera.axis.m[2].y;
      fVar10 = (float)(dVar1 * 0.005) * 0.5;
      fVar11 = cosf(fVar10);
      local_60.m[1].x = sinf(fVar10);
      local_60.m[0].y = local_60.m[1].x * 0.0;
      local_60.m[0].x = fVar11;
      local_60.m[0].z = local_60.m[0].y;
      dja::mat3::rotation((quaternion *)&local_60);
      dja::operator*(&local_60,&local_3c,&g_camera.axis);
      g_camera.axis.m[2].z = local_60.m[2].z;
      g_camera.axis.m[0].y = local_60.m[0].y;
      g_camera.axis.m[0].x = local_60.m[0].x;
      g_camera.axis.m[1].y = local_60.m[1].y;
      g_camera.axis.m[1].z = local_60.m[1].z;
      g_camera.axis.m[2].x = local_60.m[2].x;
      g_camera.axis.m[2].y = local_60.m[2].y;
      g_camera.axis.m[0].z = local_60.m[0].z;
      g_camera.axis.m[1].x = local_60.m[1].x;
      fVar10 = (float)(dVar2 * 0.005) * 0.5;
      fVar11 = cosf(fVar10);
      local_60.m[1].x = sinf(fVar10);
      local_60.m[0].y = fVar3 * local_60.m[1].x;
      local_60.m[0].z = fVar4 * local_60.m[1].x;
      local_60.m[1].x = fVar5 * local_60.m[1].x;
      local_60.m[0].x = fVar11;
      dja::mat3::rotation((quaternion *)&local_60);
      dja::operator*(&local_60,&local_3c,&g_camera.axis);
      g_camera.axis.m[2].z = local_60.m[2].z;
      g_camera.axis.m[0].x = local_60.m[0].x;
      g_camera.axis.m[0].y = local_60.m[0].y;
      g_camera.axis.m[1].y = local_60.m[1].y;
      g_camera.axis.m[1].z = local_60.m[1].z;
      g_camera.axis.m[2].x = local_60.m[2].x;
      g_camera.axis.m[2].y = local_60.m[2].y;
      g_camera.axis.m[0].z = local_60.m[0].z;
      g_camera.axis.m[1].x = local_60.m[1].x;
      fVar10 = local_60.m[0].z * local_60.m[0].z +
               local_60.m[0].x * local_60.m[0].x + local_60.m[0].y * local_60.m[0].y;
      if (fVar10 < 0.0) {
        fVar10 = sqrtf(fVar10);
      }
      else {
        fVar10 = SQRT(fVar10);
      }
      fVar10 = 1.0 / fVar10;
      g_camera.axis.m[0].z = fVar10 * g_camera.axis.m[0].z;
      g_camera.axis.m[0].y = g_camera.axis.m[0].y * fVar10;
      g_camera.axis.m[0].x = g_camera.axis.m[0].x * fVar10;
      fVar10 = g_camera.axis.m[1].z * g_camera.axis.m[1].z +
               g_camera.axis.m[1].x * g_camera.axis.m[1].x +
               g_camera.axis.m[1].y * g_camera.axis.m[1].y;
      if (fVar10 < 0.0) {
        fVar10 = sqrtf(fVar10);
      }
      else {
        fVar10 = SQRT(fVar10);
      }
      fVar10 = 1.0 / fVar10;
      g_camera.axis.m[1].x = g_camera.axis.m[1].x * fVar10;
      g_camera.axis.m[1].y = g_camera.axis.m[1].y * fVar10;
      g_camera.axis.m[1].z = fVar10 * g_camera.axis.m[1].z;
      fVar10 = g_camera.axis.m[2].z * g_camera.axis.m[2].z +
               g_camera.axis.m[2].x * g_camera.axis.m[2].x +
               g_camera.axis.m[2].y * g_camera.axis.m[2].y;
      if (fVar10 < 0.0) {
        fVar10 = sqrtf(fVar10);
      }
      else {
        fVar10 = SQRT(fVar10);
      }
      fVar10 = 1.0 / fVar10;
      g_camera.axis.m[2].z = fVar10 * g_camera.axis.m[2].z;
      g_camera.axis.m[2].y = g_camera.axis.m[2].y * fVar10;
      g_camera.axis.m[2].x = g_camera.axis.m[2].x * fVar10;
      dVar6 = x;
      dVar7 = y;
    }
    else {
      iVar8 = glfwGetMouseButton(window,1);
      fVar5 = g_camera.axis.m[2].z;
      fVar3 = g_camera.axis.m[1].z;
      fVar4 = g_camera.axis.m[0].z;
      dVar6 = x;
      dVar7 = y;
      if (iVar8 == 1) {
        fVar12 = (float)dVar1;
        fVar11 = g_camera.axis.m[0].y * fVar12;
        fVar13 = g_camera.axis.m[1].y * fVar12;
        fVar12 = fVar12 * g_camera.axis.m[2].y;
        fVar10 = g_camera.pos.z * g_camera.pos.z +
                 g_camera.pos.x * g_camera.pos.x + g_camera.pos.y * g_camera.pos.y;
        if (fVar10 < 0.0) {
          fVar10 = sqrtf(fVar10);
        }
        else {
          fVar10 = SQRT(fVar10);
        }
        g_camera.pos.x = g_camera.pos.x - fVar11 * 0.005 * fVar10;
        g_camera.pos.y = g_camera.pos.y - fVar13 * 0.005 * fVar10;
        g_camera.pos.z = g_camera.pos.z - fVar12 * 0.005 * fVar10;
        fVar11 = (float)dVar2;
        fVar10 = g_camera.pos.z * g_camera.pos.z +
                 g_camera.pos.x * g_camera.pos.x + g_camera.pos.y * g_camera.pos.y;
        if (fVar10 < 0.0) {
          fVar10 = sqrtf(fVar10);
        }
        else {
          fVar10 = SQRT(fVar10);
        }
        g_camera.pos.x = fVar4 * fVar11 * 0.005 * fVar10 + g_camera.pos.x;
        g_camera.pos.y = fVar3 * fVar11 * 0.005 * fVar10 + g_camera.pos.y;
        g_camera.pos.z = fVar5 * fVar11 * 0.005 * fVar10 + g_camera.pos.z;
        dVar6 = x;
        dVar7 = y;
      }
    }
  }
  mouseMotionCallback::y0 = dVar7;
  mouseMotionCallback::x0 = dVar6;
  return;
}

Assistant:

void mouseMotionCallback(GLFWwindow* window, double x, double y)
{
    static double x0 = 0, y0 = 0;
    double dx = x - x0,
           dy = y - y0;

    ImGuiIO& io = ImGui::GetIO();
    if (io.WantCaptureMouse)
        return;

    if (glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_LEFT) == GLFW_PRESS) {
        dja::mat3 axis = dja::transpose(g_camera.axis);
        g_camera.axis = dja::mat3::rotation(dja::vec3(0, 0, 1), dx * 5e-3)
                      * g_camera.axis;
        g_camera.axis = dja::mat3::rotation(axis[1], dy * 5e-3)
                      * g_camera.axis;
        g_camera.axis[0] = dja::normalize(g_camera.axis[0]);
        g_camera.axis[1] = dja::normalize(g_camera.axis[1]);
        g_camera.axis[2] = dja::normalize(g_camera.axis[2]);
    } else if (glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_RIGHT) == GLFW_PRESS) {
        dja::mat3 axis = dja::transpose(g_camera.axis);
        g_camera.pos-= axis[1] * dx * 5e-3 * norm(g_camera.pos);
        g_camera.pos+= axis[2] * dy * 5e-3 * norm(g_camera.pos);
    }

    x0 = x;
    y0 = y;
}